

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

Matrix<int> __thiscall Matrix<int>::operator=(Matrix<int> *this,Matrix<int> *R)

{
  int *in_RDX;
  int **extraout_RDX;
  Matrix<int> MVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix<int> *R_local;
  Matrix<int> *this_local;
  
  R->n = *in_RDX;
  R->m = in_RDX[1];
  for (local_24 = 0; local_24 < *in_RDX; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_RDX[1]; local_28 = local_28 + 1) {
      R->M[local_24][local_28] =
           *(int *)(*(long *)(*(long *)(in_RDX + 2) + (long)local_24 * 8) + (long)local_28 * 4);
    }
  }
  Matrix(this,R);
  MVar1.M = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

Matrix operator=(const Matrix& R) {
    n = R.n;
    m = R.m;
    for (int i = 0; i < R.n; i++) {
      for (int j = 0; j < R.m; j++) {
        M[i][j] = R.M[i][j];
      }
    }
    return *this;
  }